

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

string * __thiscall
cpptempl::DataValue::getvalue_abi_cxx11_(string *__return_storage_ptr__,DataValue *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_value);
  return __return_storage_ptr__;
}

Assistant:

inline std::string DataValue::getvalue()
    {
        return m_value ;
    }